

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O1

MGT_DISK_INFO * GetDiskInfo(uint8_t *p,MGT_DISK_INFO *di)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SamDosType SVar3;
  byte bVar4;
  string local_48;
  
  di->dir_tracks = 4;
  if (*(int *)(p + 0xe8) == 0x534f4442) {
    SVar3 = BDOS;
  }
  else {
    SVar3 = (SamDosType)((byte)(p[0xd2] - 1) < 0xfe);
  }
  di->dos_type = SVar3;
  if (SVar3 == BDOS) {
    if (p[0xd2] == '\0') {
      return di;
    }
    paVar2 = &local_48.field_2;
    local_48.field_2._M_allocated_capacity = *(undefined8 *)(p + 0xd2);
    local_48.field_2._8_2_ = *(undefined2 *)(p + 0xda);
    local_48._M_string_length = 10;
    local_48.field_2._M_local_buf[10] = '\0';
    psVar1 = &di->disk_label;
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_48._M_string_length = 6;
    local_48.field_2._M_local_buf[6] = 0;
    local_48.field_2._M_allocated_capacity._0_6_ = *(uint6 *)(p + 0xfa);
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)paVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    util::trim(&local_48,psVar1);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar2) {
      return di;
    }
  }
  else {
    if (SVar3 != MasterDOS) {
      return di;
    }
    bVar4 = 0x23;
    if (p[0xff] < 0x23) {
      bVar4 = p[0xff];
    }
    di->dir_tracks = (uint)(byte)(bVar4 + 4);
    di->serial_number = (uint)(ushort)(*(ushort *)(p + 0xfc) << 8 | *(ushort *)(p + 0xfc) >> 8);
    if (p[0xd2] == '*') {
      return di;
    }
    paVar2 = &local_48.field_2;
    local_48.field_2._M_allocated_capacity = *(undefined8 *)(p + 0xd2);
    local_48.field_2._8_2_ = *(undefined2 *)(p + 0xda);
    local_48._M_string_length = 10;
    local_48.field_2._M_local_buf[10] = '\0';
    psVar1 = &di->disk_label;
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    util::trim(&local_48,psVar1);
    std::__cxx11::string::operator=((string *)psVar1,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar2) {
      return di;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return di;
}

Assistant:

MGT_DISK_INFO* GetDiskInfo(const uint8_t* p, MGT_DISK_INFO& di)
{
    auto dir = reinterpret_cast<const MGT_DIR*>(p);

    // Assume 4 directory tracks until we discover otherwise
    di.dir_tracks = MGT_DIR_TRACKS;

    // Determine the disk/DOS type, as each has different capabilities
    if (!memcmp(dir->abBDOS, "BDOS", 4))
        di.dos_type = SamDosType::BDOS;
    else if (dir->abLabel[0] != 0x00 && dir->abLabel[0] != 0xff)
        di.dos_type = SamDosType::MasterDOS;
    else
        di.dos_type = SamDosType::SAMDOS;

    // Extract the remaining disk information from type-specific locations
    switch (di.dos_type)
    {
    case SamDosType::SAMDOS:
        // Nothing more to do for SAMDOS
        break;

    case SamDosType::MasterDOS:
        // Add on any extra directory tracks
        di.dir_tracks += dir->extra.bExtraDirTracks;

        // Ensure the track count is legal for MasterDOS
        if (di.dir_tracks < MGT_DIR_TRACKS)
            di.dir_tracks = MGT_DIR_TRACKS;
        else if (di.dir_tracks > 39)
            di.dir_tracks = 39;

        // 16-bit random value used as a disk serial number
        di.serial_number = (dir->extra.abSerial[0] << 8) | dir->extra.abSerial[1];

        // MasterDOS uses '*' for 'no label'
        if (dir->abLabel[0] != '*')
        {
            di.disk_label = std::string(reinterpret_cast<const char*>(dir->abLabel), sizeof(dir->abLabel));
            di.disk_label = util::trim(di.disk_label);
        }
        break;

    case SamDosType::BDOS:
        // BDOS uses a null for 'no label'
        if (dir->abLabel[0])
        {
            di.disk_label = std::string(reinterpret_cast<const char*>(&dir->abLabel), sizeof(dir->abLabel));
            di.disk_label += std::string(reinterpret_cast<const char*>(&dir->extra.bDirTag), sizeof(dir->szLabelExtra));
            di.disk_label = util::trim(di.disk_label);
        }
        break;
    }

    return &di;
}